

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsvg.c
# Opt level: O1

FT_Error tt_face_load_svg_doc(FT_GlyphSlot glyph,FT_UInt glyph_index)

{
  FT_UInt *pFVar1;
  FT_Size pFVar2;
  undefined8 uVar3;
  FT_Fixed FVar4;
  FT_Fixed FVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  bool bVar8;
  FT_Memory memory;
  FT_GlyphSlot pFVar9;
  Svg_doc *pSVar10;
  uint uVar11;
  FT_Error FVar12;
  Svg_doc *pSVar13;
  uint uVar14;
  FT_Byte *stream;
  ulong in_R8;
  uint uVar15;
  uint uVar16;
  FT_Byte *stream_00;
  FT_Byte *pFVar17;
  FT_UShort unaff_R14W;
  char cVar18;
  FT_Error error;
  FT_ULong uncomp_size;
  FT_Error local_74;
  FT_Byte *local_70;
  Svg_doc *local_68;
  FT_GlyphSlot local_60;
  Svg_doc local_58;
  undefined8 *local_40;
  FT_Memory local_38;
  
  stream = (FT_Byte *)(ulong)glyph_index;
  local_74 = 0;
  local_40 = (undefined8 *)glyph->other;
  local_38 = glyph->face->memory;
  pSVar10 = (Svg_doc *)glyph->face[5].extensions;
  pFVar17 = (FT_Byte *)pSVar10->offset;
  local_68 = pSVar10;
  if (pSVar10->end_glyph_id == 0) {
    cVar18 = '\0';
    FVar12 = 8;
    goto LAB_0024d3e1;
  }
  stream_00 = (FT_Byte *)((long)pFVar17 + 2);
  uVar14 = pSVar10->end_glyph_id - 1;
  local_70 = pFVar17;
  extract_svg_doc(&local_58,stream_00);
  unaff_R14W = local_58.start_glyph_id;
  stream = stream_00 + uVar14 * 0xc;
  pSVar10 = extract_svg_doc(&local_58,stream);
  FVar12 = 0x10;
  if (glyph_index < unaff_R14W) {
    uVar16 = 0;
LAB_0024d3dc:
    cVar18 = (char)uVar16;
    pFVar17 = local_70;
  }
  else {
    uVar16 = 0;
    pFVar9 = glyph;
    if (local_58.start_glyph_id <= glyph_index) {
      pSVar10 = (Svg_doc *)(ulong)local_58.end_glyph_id;
      pFVar9 = glyph;
      if (local_58.end_glyph_id < glyph_index) goto LAB_0024d3dc;
    }
    do {
      local_60 = pFVar9;
      uVar15 = uVar16 + uVar14 >> 1;
      extract_svg_doc(&local_58,stream_00 + uVar15 * 0xc);
      stream = (FT_Byte *)(local_58._0_8_ & 0xffff);
      uVar11 = (uint)(local_58.end_glyph_id < glyph_index);
      if (glyph_index < local_58.start_glyph_id) {
        uVar11 = 0xffffffff;
      }
      unaff_R14W = local_58.end_glyph_id;
      pSVar10 = (Svg_doc *)local_58.offset;
      in_R8 = local_58.length;
      glyph = local_60;
      if (uVar11 == 0xffffffff) {
        uVar14 = uVar15 - 1;
      }
      else {
        if (uVar11 != 1) {
          FVar12 = 0;
          uVar16 = 1;
          goto LAB_0024d3dc;
        }
        uVar16 = uVar15 + 1;
      }
      pFVar9 = local_60;
    } while (uVar16 <= uVar14);
    cVar18 = '\0';
    FVar12 = 0x10;
    pFVar17 = local_70;
  }
LAB_0024d3e1:
  memory = local_38;
  local_74 = FVar12;
  if (cVar18 != '\0') {
    pSVar13 = (Svg_doc *)((local_68->length - (long)pFVar17) + *(long *)(local_68 + 1));
    if ((ulong)((long)pSVar13 - (long)pSVar10) < in_R8 || pSVar13 < pSVar10) {
      local_74 = 8;
    }
    else {
      pFVar17 = (FT_Byte *)((long)&pSVar10->start_glyph_id + (long)pFVar17);
      if ((((6 < in_R8) && (*pFVar17 == '\x1f')) && (pFVar17[1] == 0x8b)) && (pFVar17[2] == '\b')) {
        local_68 = (Svg_doc *)CONCAT44(local_68._4_4_,(int)stream);
        local_58._0_8_ = ZEXT48(*(uint *)(pFVar17 + (in_R8 - 4)));
        local_70 = (FT_Byte *)ft_mem_qalloc(local_38,local_58._0_8_,&local_74);
        local_60 = (FT_GlyphSlot)in_R8;
        if (local_74 == 0) {
          local_74 = FT_Gzip_Uncompress(memory,local_70,(FT_ULong *)&local_58,pFVar17,in_R8);
          if (local_74 == 0) {
            pFVar1 = &glyph->internal->flags;
            *pFVar1 = *pFVar1 | 2;
            bVar8 = true;
            stream = (FT_Byte *)((ulong)local_68 & 0xffffffff);
            local_74 = 0;
            local_60 = (FT_GlyphSlot)local_58._0_8_;
          }
          else {
            ft_mem_free(memory,local_70);
            local_74 = 8;
            bVar8 = false;
            stream = (FT_Byte *)((ulong)local_68 & 0xffffffff);
            local_70 = pFVar17;
          }
        }
        else {
          bVar8 = false;
          stream = (FT_Byte *)((ulong)local_68 & 0xffffffff);
          local_70 = pFVar17;
        }
        in_R8 = (ulong)local_60;
        pFVar17 = local_70;
        if (!bVar8) {
          return local_74;
        }
      }
      *local_40 = pFVar17;
      local_40[1] = in_R8;
      pFVar2 = glyph->face->size;
      local_40[8] = (pFVar2->metrics).max_advance;
      uVar3 = *(undefined8 *)&pFVar2->metrics;
      FVar4 = (pFVar2->metrics).x_scale;
      FVar5 = (pFVar2->metrics).y_scale;
      FVar6 = (pFVar2->metrics).ascender;
      FVar7 = (pFVar2->metrics).height;
      local_40[6] = (pFVar2->metrics).descender;
      local_40[7] = FVar7;
      local_40[4] = FVar5;
      local_40[5] = FVar6;
      local_40[2] = uVar3;
      local_40[3] = FVar4;
      *(FT_UShort *)(local_40 + 9) = glyph->face->units_per_EM;
      *(short *)((long)local_40 + 0x4a) = (short)stream;
      *(FT_UShort *)((long)local_40 + 0x4c) = unaff_R14W;
      local_40[10] = 0x10000;
      local_40[0xb] = 0;
      local_40[0xc] = 0;
      local_40[0xd] = 0x10000;
      local_40[0xe] = 0;
      local_40[0xf] = 0;
      glyph->other = local_40;
    }
  }
  return local_74;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_svg_doc( FT_GlyphSlot  glyph,
                        FT_UInt       glyph_index )
  {
    FT_Error   error  = FT_Err_Ok;
    TT_Face    face   = (TT_Face)glyph->face;
    FT_Memory  memory = face->root.memory;
    Svg*       svg    = (Svg*)face->svg;

    FT_Byte*  doc_list;
    FT_ULong  doc_limit;

    FT_Byte*   doc;
    FT_ULong   doc_offset;
    FT_ULong   doc_length;
    FT_UShort  doc_start_glyph_id;
    FT_UShort  doc_end_glyph_id;

    FT_SVG_Document  svg_document = (FT_SVG_Document)glyph->other;


    FT_ASSERT( !( svg == NULL ) );

    doc_list = svg->svg_doc_list;

    error = find_doc( doc_list + 2, svg->num_entries, glyph_index,
                                    &doc_offset, &doc_length,
                                    &doc_start_glyph_id, &doc_end_glyph_id );
    if ( error != FT_Err_Ok )
      goto Exit;

    doc_limit = svg->table_size -
                  (FT_ULong)( doc_list - (FT_Byte*)svg->table );
    if ( doc_offset > doc_limit              ||
         doc_length > doc_limit - doc_offset )
    {
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    doc = doc_list + doc_offset;

    if ( doc_length > 6 &&
         doc[0] == 0x1F &&
         doc[1] == 0x8B &&
         doc[2] == 0x08 )
    {
#ifdef FT_CONFIG_OPTION_USE_ZLIB

      FT_ULong  uncomp_size;
      FT_Byte*  uncomp_buffer = NULL;


      /*
       * Get the size of the original document.  This helps in allotting the
       * buffer to accommodate the uncompressed version.  The last 4 bytes
       * of the compressed document are equal to the original size modulo
       * 2^32.  Since the size of SVG documents is less than 2^32 bytes we
       * can use this accurately.  The four bytes are stored in
       * little-endian format.
       */
      FT_TRACE4(( "SVG document is GZIP compressed\n" ));
      uncomp_size = (FT_ULong)doc[doc_length - 1] << 24 |
                    (FT_ULong)doc[doc_length - 2] << 16 |
                    (FT_ULong)doc[doc_length - 3] << 8  |
                    (FT_ULong)doc[doc_length - 4];

      if ( FT_QALLOC( uncomp_buffer, uncomp_size ) )
        goto Exit;

      error = FT_Gzip_Uncompress( memory,
                                  uncomp_buffer,
                                  &uncomp_size,
                                  doc,
                                  doc_length );
      if ( error )
      {
        FT_FREE( uncomp_buffer );
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      glyph->internal->flags |= FT_GLYPH_OWN_GZIP_SVG;

      doc        = uncomp_buffer;
      doc_length = uncomp_size;

#else /* !FT_CONFIG_OPTION_USE_ZLIB */

      error = FT_THROW( Unimplemented_Feature );
      goto Exit;

#endif /* !FT_CONFIG_OPTION_USE_ZLIB */
    }

    svg_document->svg_document        = doc;
    svg_document->svg_document_length = doc_length;

    svg_document->metrics      = glyph->face->size->metrics;
    svg_document->units_per_EM = glyph->face->units_per_EM;

    svg_document->start_glyph_id = doc_start_glyph_id;
    svg_document->end_glyph_id   = doc_end_glyph_id;

    svg_document->transform.xx = 0x10000;
    svg_document->transform.xy = 0;
    svg_document->transform.yx = 0;
    svg_document->transform.yy = 0x10000;

    svg_document->delta.x = 0;
    svg_document->delta.y = 0;

    FT_TRACE5(( "start_glyph_id: %d\n", doc_start_glyph_id ));
    FT_TRACE5(( "end_glyph_id:   %d\n", doc_end_glyph_id ));
    FT_TRACE5(( "svg_document:\n" ));
    FT_TRACE5(( " %.*s\n", (FT_UInt)doc_length, doc ));

    glyph->other = svg_document;

  Exit:
    return error;
  }